

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintStatus(ostream *debugStream,uint32_t status)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  uint port;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar2 = BoardIO::GetFpgaVersionMajorFromStatus(status);
  std::operator<<(debugStream,"Status: ");
  if (uVar2 == 1) {
    debugStream = std::operator<<(debugStream,"No Ethernet present");
    goto LAB_00111a80;
  }
  if (uVar2 == 0) {
    poVar3 = std::operator<<(debugStream,"Unknown FPGA, status = ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    debugStream = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    goto LAB_00111a80;
  }
  if (uVar2 == 2) {
    if ((status >> 0x1e & 1) != 0) {
      std::operator<<(debugStream,"error ");
    }
    if ((status >> 0x1d & 1) != 0) {
      std::operator<<(debugStream,"initOK ");
    }
  }
  if ((status >> 0x1c & 1) != 0) {
    std::operator<<(debugStream,"FrameErr ");
  }
  if ((status >> 0x1b & 1) != 0) {
    std::operator<<(debugStream,"IPv4Err ");
  }
  if ((status >> 0x1a & 1) != 0) {
    std::operator<<(debugStream,"UDPErr ");
  }
  if ((status >> 0x19 & 1) != 0) {
    std::operator<<(debugStream,"DestErr ");
  }
  if ((status >> 0x18 & 1) != 0) {
    std::operator<<(debugStream,"AccessErr ");
  }
  bVar6 = (status >> 0x17 & 1) != 0;
  if (bVar6 && uVar2 == 2) {
    pcVar4 = "StateErr ";
LAB_0011189a:
    bVar7 = bVar6 && uVar2 == 2;
    std::operator<<(debugStream,pcVar4);
  }
  else {
    bVar7 = uVar2 != 3;
    if ((status >> 0x17 & 1) != 0 && !bVar7) {
      pcVar4 = "Clk125 ";
      goto LAB_0011189a;
    }
  }
  if ((status >> 0x16 & 1) != 0) {
    std::operator<<(debugStream,"EthStateErr ");
  }
  if ((status >> 0x15 & 1) != 0 && !bVar7) {
    std::operator<<(debugStream,"Clk200 ");
  }
  if ((status >> 0x14 & 1) != 0) {
    std::operator<<(debugStream,"UDP ");
  }
  if (uVar2 != 2) {
    if ((status >> 0x10 & 1) != 0) {
      std::operator<<(debugStream,"PS-Eth ");
    }
    std::endl<char,std::char_traits<char>>(debugStream);
    lVar5 = 1;
    do {
      if (lVar5 == 3) {
        return;
      }
      poVar3 = std::operator<<(debugStream,"Port ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,": ");
      bVar1 = FpgaIO::GetEthernetPortStatusV3(status,(uint)lVar5);
      if ((char)bVar1 < '\0') {
        std::operator<<(debugStream,"initOK ");
      }
      if ((bVar1 & 0x40) != 0) {
        std::operator<<(debugStream,"hasIRQ ");
      }
      pcVar4 = "Link-On ";
      if ((bVar1 & 0x20) == 0) {
        pcVar4 = "Link-Off ";
      }
      std::operator<<(debugStream,pcVar4);
      pcVar4 = "10 Mbps ";
      switch(bVar1 >> 3 & 3) {
      case 1:
        pcVar4 = "100 Mbps ";
        break;
      case 2:
        pcVar4 = "1000 Mbps ";
        break;
      case 3:
        goto switchD_001119c4_caseD_3;
      }
      std::operator<<(debugStream,pcVar4);
switchD_001119c4_caseD_3:
      if ((bVar1 & 4) != 0) {
        std::operator<<(debugStream,"RecvErr ");
      }
      if ((bVar1 & 2) != 0) {
        std::operator<<(debugStream,"SendOvf ");
      }
      if ((bVar1 & 1) != 0) {
        std::operator<<(debugStream,"PS-Eth ");
      }
      std::endl<char,std::char_traits<char>>(debugStream);
      lVar5 = lVar5 + 1;
    } while( true );
  }
  pcVar4 = "Link-On ";
  if ((status >> 0x13 & 1) == 0) {
    pcVar4 = "Link-Off ";
  }
  std::operator<<(debugStream,pcVar4);
  if ((status >> 0x12 & 1) != 0) {
    std::operator<<(debugStream,"ETH-idle ");
  }
  std::operator<<(debugStream,&DAT_00117c00 + *(int *)(&DAT_00117c00 + (status >> 0xe & 0xc)));
LAB_00111a80:
  std::endl<char,std::char_traits<char>>(debugStream);
  return;
}

Assistant:

void EthBasePort::PrintStatus(std::ostream &debugStream, uint32_t status)
{
    unsigned int ver = BoardIO::GetFpgaVersionMajorFromStatus(status);
    debugStream << "Status: ";
    if (ver == 0) {
        debugStream << "Unknown FPGA, status = " << std::hex << status << std::dec << std::endl;
    }
    else if (ver == 1) {
        // FPGA V1
        debugStream << "No Ethernet present" << std::endl;
    }
    else {
        // FPGA V2 or V3
        if (ver == 2) {
            if (status&FpgaIO::ETH_STAT_REQ_ERR_V2) debugStream << "error ";
            if (status&FpgaIO::ETH_STAT_INIT_OK_V2) debugStream << "initOK ";
        }
        if (status & FpgaIO::ETH_STAT_FRAME_ERR)    debugStream << "FrameErr ";
        if (status & FpgaIO::ETH_STAT_IPV4_ERR)     debugStream << "IPv4Err ";
        if (status & FpgaIO::ETH_STAT_UDP_ERR)      debugStream << "UDPErr ";
        if (status & FpgaIO::ETH_STAT_DEST_ERR)     debugStream << "DestErr ";
        if (status & FpgaIO::ETH_STAT_ACCESS_ERR)   debugStream << "AccessErr ";
        if ((ver == 2) && (status & FpgaIO::ETH_STAT_STATE_ERR_V2)) debugStream << "StateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK125_OK_V3)) debugStream << "Clk125 ";
        if (status & FpgaIO::ETH_STAT_ETHST_ERR )   debugStream << "EthStateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK200_OK_V3)) debugStream << "Clk200 ";
        if (status & FpgaIO::ETH_STAT_UDP)          debugStream << "UDP ";
        if (ver == 2) {
            if (status & FpgaIO::ETH_STAT_LINK_STAT_V2) debugStream << "Link-On ";
            else                                        debugStream << "Link-Off ";
            if (status & FpgaIO::ETH_STAT_IDLE_V2)  debugStream << "ETH-idle ";
            int waitInfo = (status & FpgaIO::ETH_STAT_WAIT_MASK_V2)>>16;
            if (waitInfo == 0) debugStream << "wait-none";
            else if (waitInfo == 1) debugStream << "wait-recv";
            else if (waitInfo == 2) debugStream << "wait-send";
            else debugStream << "wait-flush";
            debugStream << std::endl;
        }
        else {   // ver == 3
            // Following bit introduced in Firmware Rev 9, but was previously 0
            if (status & FpgaIO::ETH_STAT_PSETH_EN_V3) debugStream << "PS-Eth ";
            debugStream << std::endl;
            for (unsigned int port = 1; port <= 2; port++) {
                debugStream << "Port " << port << ": ";
                uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, port);
                if (portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)   debugStream << "initOK ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_HAS_IRQ)   debugStream << "hasIRQ ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_LINK_STAT) debugStream << "Link-On ";
                else                                              debugStream << "Link-Off ";
                uint8_t linkSpeed = (portStatus & FpgaIO::ETH_PORT_STAT_SPEED_MASK)>>3;
                if (linkSpeed == 0)                               debugStream << "10 Mbps ";
                else if (linkSpeed == 1)                          debugStream << "100 Mbps ";
                else if (linkSpeed == 2)                          debugStream << "1000 Mbps ";
                // Following are only for Firmware Rev 8
                if (portStatus & FpgaIO::ETH_PORT_STAT_RECV_ERR)  debugStream << "RecvErr ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_SEND_OVF)  debugStream << "SendOvf ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_PS_ETH)    debugStream << "PS-Eth ";
                debugStream << std::endl;
            }
        }
    }
}